

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-emscripten.cpp
# Opt level: O0

Global * wasm::getStackPointerGlobal(Module *wasm)

{
  bool bVar1;
  reference puVar2;
  pointer pGVar3;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *g_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *__range1_1;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *g;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *__range1;
  Module *wasm_local;
  
  __end1 = std::
           vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ::begin(&wasm->globals);
  g = (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
      std::
      vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
      ::end(&wasm->globals);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                                     *)&g), bVar1) {
    puVar2 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
             ::operator*(&__end1);
    pGVar3 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->(puVar2);
    bVar1 = Importable::imported(&pGVar3->super_Importable);
    if (bVar1) {
      pGVar3 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->(puVar2)
      ;
      bVar1 = IString::operator==(&(pGVar3->super_Importable).base.super_IString,
                                  (IString *)STACK_POINTER);
      if (bVar1) {
        pGVar3 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::get(puVar2);
        return pGVar3;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ::begin(&wasm->globals);
  g_1 = (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
        std::
        vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
        ::end(&wasm->globals);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                        *)&g_1);
    if (!bVar1) {
      return (Global *)0x0;
    }
    puVar2 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
             ::operator*(&__end1_1);
    pGVar3 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->(puVar2);
    bVar1 = Importable::imported(&pGVar3->super_Importable);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
    ::operator++(&__end1_1);
  }
  pGVar3 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::get(puVar2);
  return pGVar3;
}

Assistant:

Global* getStackPointerGlobal(Module& wasm) {
  // Assumption: The stack pointer is either imported as __stack_pointer or
  // we just assume it's the first non-imported global.
  // TODO(sbc): Find a better way to discover the stack pointer.  Perhaps the
  // linker could export it by name?
  for (auto& g : wasm.globals) {
    if (g->imported() && g->base == STACK_POINTER) {
      return g.get();
    }
  }
  for (auto& g : wasm.globals) {
    if (!g->imported()) {
      return g.get();
    }
  }
  return nullptr;
}